

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask.c
# Opt level: O1

void aom_blend_a64_mask_c
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h,int subw,int subh
               )

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  uint local_50;
  uint local_4c;
  uint local_48;
  
  if (subh == 0 && subw == 0) {
    if (0 < h) {
      local_4c = 0;
      local_50 = 0;
      uVar5 = 0;
      uVar8 = 0;
      iVar12 = 0;
      do {
        iVar2 = (int)uVar5;
        if (0 < w) {
          uVar4 = (ulong)(uint)w;
          uVar10 = local_4c;
          uVar3 = local_50;
          uVar13 = uVar8;
          do {
            dst[uVar13] = (uint8_t)((uint)src0[uVar3] * (uint)mask[uVar10] +
                                    (uint)src1[uVar5] * (0x40 - (uint)mask[uVar10]) + 0x20 >> 6);
            uVar13 = uVar13 + 1;
            uVar5 = (ulong)((int)uVar5 + 1);
            uVar3 = uVar3 + 1;
            uVar10 = uVar10 + 1;
            uVar4 = uVar4 - 1;
          } while (uVar4 != 0);
        }
        iVar12 = iVar12 + 1;
        uVar8 = uVar8 + dst_stride;
        uVar5 = (ulong)(iVar2 + src1_stride);
        local_50 = local_50 + src0_stride;
        local_4c = local_4c + mask_stride;
      } while (iVar12 != h);
    }
  }
  else if (subh == 1 && (subw ^ 1U) == 0) {
    if (0 < h) {
      iVar12 = mask_stride * 2;
      iVar11 = 0;
      local_50 = 0;
      local_4c = 0;
      local_48 = 0;
      iVar2 = 0;
      do {
        if (0 < w) {
          lVar14 = 0;
          uVar8 = local_50;
          uVar13 = local_4c;
          uVar10 = local_48;
          do {
            iVar1 = (int)lVar14;
            uVar3 = (uint)mask[mask_stride + iVar1 + 1] +
                    (uint)mask[iVar11 + iVar1 + 1] +
                    (uint)mask[mask_stride + iVar1] + (uint)mask[(uint)(iVar11 + iVar1)] + 2 >> 2;
            dst[uVar10] = (uint8_t)((uint)src1[uVar13] * (0x40 - uVar3) + src0[uVar8] * uVar3 + 0x20
                                   >> 6);
            uVar10 = uVar10 + 1;
            uVar13 = uVar13 + 1;
            uVar8 = uVar8 + 1;
            lVar14 = lVar14 + 2;
          } while ((ulong)(uint)w * 2 != lVar14);
        }
        iVar2 = iVar2 + 1;
        local_48 = local_48 + dst_stride;
        local_4c = local_4c + src1_stride;
        local_50 = local_50 + src0_stride;
        iVar11 = iVar11 + iVar12;
        mask_stride = mask_stride + iVar12;
      } while (iVar2 != h);
    }
  }
  else if ((subw ^ 1U) == 0 && subh == 0) {
    if (0 < h) {
      local_50 = 0;
      local_4c = 1;
      uVar5 = 0;
      uVar8 = 0;
      iVar12 = 0;
      do {
        iVar2 = (int)uVar5;
        if (0 < w) {
          uVar4 = (ulong)(uint)w;
          uVar10 = local_4c;
          uVar3 = local_50;
          uVar13 = uVar8;
          do {
            uVar6 = (uint)mask[uVar10 - 1] + (uint)mask[uVar10] + 1 >> 1 & 0xff;
            dst[uVar13] = (uint8_t)((uint)src1[uVar5] * (0x40 - uVar6) + src0[uVar3] * uVar6 + 0x20
                                   >> 6);
            uVar13 = uVar13 + 1;
            uVar5 = (ulong)((int)uVar5 + 1);
            uVar3 = uVar3 + 1;
            uVar10 = uVar10 + 2;
            uVar4 = uVar4 - 1;
          } while (uVar4 != 0);
        }
        iVar12 = iVar12 + 1;
        uVar8 = uVar8 + dst_stride;
        uVar5 = (ulong)(iVar2 + src1_stride);
        local_50 = local_50 + src0_stride;
        local_4c = local_4c + mask_stride;
      } while (iVar12 != h);
    }
  }
  else if (0 < h) {
    local_50 = 0;
    local_4c = 0;
    uVar8 = 0;
    uVar13 = 0;
    iVar12 = 0;
    do {
      if (0 < w) {
        uVar5 = (ulong)(uint)w;
        uVar6 = local_50;
        uVar9 = local_4c;
        uVar10 = uVar13;
        uVar3 = uVar8;
        do {
          uVar7 = (uint)mask[uVar6] + (uint)mask[mask_stride + uVar6] + 1 >> 1 & 0xff;
          dst[uVar10] = (uint8_t)((uint)src1[uVar3] * (0x40 - uVar7) + src0[uVar9] * uVar7 + 0x20 >>
                                 6);
          uVar10 = uVar10 + 1;
          uVar3 = uVar3 + 1;
          uVar9 = uVar9 + 1;
          uVar6 = uVar6 + 1;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      iVar12 = iVar12 + 1;
      uVar13 = uVar13 + dst_stride;
      uVar8 = uVar8 + src1_stride;
      local_4c = local_4c + src0_stride;
      local_50 = local_50 + mask_stride * 2;
    } while (iVar12 != h);
  }
  return;
}

Assistant:

void aom_blend_a64_mask_c(uint8_t *dst, uint32_t dst_stride,
                          const uint8_t *src0, uint32_t src0_stride,
                          const uint8_t *src1, uint32_t src1_stride,
                          const uint8_t *mask, uint32_t mask_stride, int w,
                          int h, int subw, int subh) {
  int i, j;

  assert(IMPLIES(src0 == dst, src0_stride == dst_stride));
  assert(IMPLIES(src1 == dst, src1_stride == dst_stride));

  assert(h >= 1);
  assert(w >= 1);
  assert(IS_POWER_OF_TWO(h));
  assert(IS_POWER_OF_TWO(w));

  if (subw == 0 && subh == 0) {
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; ++j) {
        const int m = mask[i * mask_stride + j];
        dst[i * dst_stride + j] = AOM_BLEND_A64(m, src0[i * src0_stride + j],
                                                src1[i * src1_stride + j]);
      }
    }
  } else if (subw == 1 && subh == 1) {
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; ++j) {
        const int m = ROUND_POWER_OF_TWO(
            mask[(2 * i) * mask_stride + (2 * j)] +
                mask[(2 * i + 1) * mask_stride + (2 * j)] +
                mask[(2 * i) * mask_stride + (2 * j + 1)] +
                mask[(2 * i + 1) * mask_stride + (2 * j + 1)],
            2);
        dst[i * dst_stride + j] = AOM_BLEND_A64(m, src0[i * src0_stride + j],
                                                src1[i * src1_stride + j]);
      }
    }
  } else if (subw == 1 && subh == 0) {
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; ++j) {
        const int m = AOM_BLEND_AVG(mask[i * mask_stride + (2 * j)],
                                    mask[i * mask_stride + (2 * j + 1)]);
        dst[i * dst_stride + j] = AOM_BLEND_A64(m, src0[i * src0_stride + j],
                                                src1[i * src1_stride + j]);
      }
    }
  } else {
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; ++j) {
        const int m = AOM_BLEND_AVG(mask[(2 * i) * mask_stride + j],
                                    mask[(2 * i + 1) * mask_stride + j]);
        dst[i * dst_stride + j] = AOM_BLEND_A64(m, src0[i * src0_stride + j],
                                                src1[i * src1_stride + j]);
      }
    }
  }
}